

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_signal.cpp
# Opt level: O3

void tst_signal_onDestruction(void)

{
  Node *pNVar1;
  ostream *poVar2;
  socklen_t in_ECX;
  undefined **local_28;
  OnSignalIncrement increment;
  
  pNVar1 = rengine::Node::create();
  local_28 = &PTR__SignalHandler_00115bd8;
  increment.super_SignalHandler<>._vptr_SignalHandler._0_4_ = 0;
  rengine::Signal<>::connect
            (&rengine::SignalEmitter::onDestruction,(int)pNVar1,(sockaddr *)&local_28,in_ECX);
  if ((int)increment.super_SignalHandler<>._vptr_SignalHandler != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    poVar2 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        (int)increment.super_SignalHandler<>._vptr_SignalHandler);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' vs \'",6);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if ((int)increment.super_SignalHandler<>._vptr_SignalHandler != 0) {
      __assert_fail("(increment.value) == (0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                    ,0x68,"void tst_signal_onDestruction()");
    }
  }
  (*(pNVar1->super_SignalEmitter)._vptr_SignalEmitter[2])(pNVar1);
  if ((int)increment.super_SignalHandler<>._vptr_SignalHandler != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    poVar2 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        (int)increment.super_SignalHandler<>._vptr_SignalHandler);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' vs \'",6);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if ((int)increment.super_SignalHandler<>._vptr_SignalHandler != 1) {
      __assert_fail("(increment.value) == (1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                    ,0x6a,"void tst_signal_onDestruction()");
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"void tst_signal_onDestruction()",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ok",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  return;
}

Assistant:

void tst_signal_onDestruction()
{
    Node *node = Node::create();

    OnSignalIncrement increment;
    SignalEmitter::onDestruction.connect(node, &increment);

    check_equal(increment.value, 0);
    node->destroy();
    check_equal(increment.value, 1);

    cout << __PRETTY_FUNCTION__ << ": ok" << endl;
}